

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::CombinationalLoopVisitor::check_var(Var *var)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  int iVar2;
  AssignmentType AVar3;
  IRNodeKind IVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  Var **ppVVar6;
  undefined4 extraout_var_00;
  StmtException *this;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  allocator<kratos::IRNode_*> local_171;
  element_type *local_170;
  Var *local_168;
  element_type **local_160;
  size_type local_158;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_150;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_138;
  char local_108 [32];
  string local_e8;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *local_c8;
  value_type *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *sources;
  Var *var_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [42];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  iVar2 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  __end2 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var,iVar2));
  stmt = (value_type *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var,iVar2));
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                       ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt);
    if (!bVar1) {
      return;
    }
    local_c8 = &std::__detail::
                _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                          (&__end2)->
                super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8);
    AVar3 = AssignStmt::assign_type(peVar5);
    if (AVar3 == Blocking) {
      peVar5 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_c8);
      ppVVar6 = AssignStmt::right(peVar5);
      bVar1 = has_var(*ppVVar6,var);
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_c8);
        iVar2 = (*(peVar5->super_Stmt).super_IRNode._vptr_IRNode[4])();
        IVar4 = IRNode::ir_node_kind((IRNode *)CONCAT44(extraout_var_00,iVar2));
        if (IVar4 == GeneratorKind) {
          this = (StmtException *)__cxa_allocate_exception(0x10);
          peVar5 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c8);
          ppVVar6 = AssignStmt::left(peVar5);
          (*((*ppVVar6)->super_IRNode)._vptr_IRNode[0x1f])(local_108);
          peVar5 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c8);
          ppVVar6 = AssignStmt::right(peVar5);
          (*((*ppVVar6)->super_IRNode)._vptr_IRNode[0x1f])(&local_138);
          local_38 = &local_e8;
          local_40 = "Combinational loop detected at {0} <- {1}";
          local_48 = (char (*) [42])local_108;
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_138;
          fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[42],char>
                    (&local_78,(v7 *)"Combinational loop detected at {0} <- {1}",local_48,
                     (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
          local_58 = &local_78;
          local_88 = fmt::v7::to_string_view<char,_0>(local_40);
          local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&var_local;
          local_30 = local_58;
          local_20 = local_58;
          local_10 = local_58;
          local_18 = local_28;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_28,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_58);
          format_str.size_ = (size_t)var_local;
          format_str.data_ = (char *)local_88.size_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_90.values_;
          fmt::v7::detail::vformat_abi_cxx11_(&local_e8,(detail *)local_88.data_,format_str,args);
          local_170 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                (local_c8);
          local_160 = &local_170;
          local_158 = 2;
          local_168 = var;
          std::allocator<kratos::IRNode_*>::allocator(&local_171);
          __l._M_len = local_158;
          __l._M_array = (iterator)local_160;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_150,__l,&local_171);
          StmtException::StmtException(this,&local_e8,&local_150);
          __cxa_throw(this,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end2);
  } while( true );
}

Assistant:

static void check_var(Var* var) {
        // get all the sources
        auto const& sources = var->sources();
        for (auto const& stmt : sources) {
            if (stmt->assign_type() == AssignmentType::Blocking && has_var(stmt->right(), var) &&
                stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind) {
                throw StmtException(::format("Combinational loop detected at {0} <- {1}",
                                             stmt->left()->to_string(), stmt->right()->to_string()),
                                    {stmt.get(), var});
            }
        }
    }